

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O3

VulkanRecycledFence * __thiscall
VulkanUtilities::VulkanSyncObjectManager::CreateFence
          (VulkanRecycledFence *__return_storage_ptr__,VulkanSyncObjectManager *this)

{
  mutex *__mutex;
  pointer ppVVar1;
  VkFence_T *pVVar2;
  int iVar3;
  VkFence vkFence;
  VkFenceCreateInfo FenceCI;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  VkFence local_40;
  VkFenceCreateInfo local_38;
  
  __mutex = &this->m_FencePoolGuard;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  ppVVar1 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppVVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_38.flags = 0;
    local_38._20_4_ = 0;
    local_38.pNext = (void *)0x0;
    local_40 = (NativeType)0x0;
    local_38.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
    local_38._4_4_ = 0;
    (*vkCreateFence)(this->m_LogicalDevice->m_VkDevice,&local_38,(VkAllocationCallbacks *)0x0,
                     &local_40);
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
              ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> *)
               &local_50,
               (__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *)
               this);
    (__return_storage_ptr__->m_pManager).
    super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_50;
    (__return_storage_ptr__->m_pManager).
    super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_48;
    if (local_48 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      __return_storage_ptr__->m_VkSyncObject = local_40;
      __return_storage_ptr__->m_IsUnsignaled = false;
      return __return_storage_ptr__;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
      __return_storage_ptr__->m_VkSyncObject = local_40;
      __return_storage_ptr__->m_IsUnsignaled = false;
      if (local_48 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
      __return_storage_ptr__->m_VkSyncObject = local_40;
      __return_storage_ptr__->m_IsUnsignaled = false;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    return __return_storage_ptr__;
  }
  pVVar2 = ppVVar1[-1];
  (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar1 + -1;
  std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
            ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> *)
             &local_60,
             (__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *)
             this);
  (__return_storage_ptr__->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_60;
  (__return_storage_ptr__->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_58;
  if (local_58 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __return_storage_ptr__->m_VkSyncObject = pVVar2;
    __return_storage_ptr__->m_IsUnsignaled = false;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
      __return_storage_ptr__->m_VkSyncObject = pVVar2;
      __return_storage_ptr__->m_IsUnsignaled = false;
      if (local_58 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002cb66e;
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
      __return_storage_ptr__->m_VkSyncObject = pVVar2;
      __return_storage_ptr__->m_IsUnsignaled = false;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
LAB_002cb66e:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

VulkanRecycledFence VulkanSyncObjectManager::CreateFence()
{
    {
        std::lock_guard<std::mutex> Lock{m_FencePoolGuard};

        if (!m_FencePool.empty())
        {
            auto vkFence = m_FencePool.back();
            m_FencePool.pop_back();
            return {shared_from_this(), vkFence};
        }
    }

    VkFenceCreateInfo FenceCI = {};
    VkFence           vkFence = VK_NULL_HANDLE;

    FenceCI.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
    vkCreateFence(m_LogicalDevice.GetVkDevice(), &FenceCI, nullptr, &vkFence);

    return {shared_from_this(), vkFence};
}